

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O3

void __thiscall
gmath::PinholeCamera::reconstructRay(PinholeCamera *this,Vector3d *V,Vector3d *C,Vector2d *p)

{
  double dVar1;
  int i_1;
  Matrix33d *pMVar2;
  long lVar3;
  int k;
  long lVar4;
  SVector<double,_3> ret;
  Vector3d Pc;
  double local_58 [4];
  Vector3d local_38;
  
  local_38.v[0] = 0.0;
  local_38.v[1] = 0.0;
  lVar4 = 0;
  local_38.v[2] = 0.0;
  reconstructLocal(this,&local_38,p);
  pMVar2 = &(this->super_Camera).R;
  local_58[2] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  do {
    dVar1 = local_58[lVar4];
    lVar3 = 0;
    do {
      dVar1 = dVar1 + pMVar2->v[0][lVar3] * local_38.v[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    local_58[lVar4] = dVar1;
    lVar4 = lVar4 + 1;
    pMVar2 = (Matrix33d *)(pMVar2->v + 1);
  } while (lVar4 != 3);
  V->v[2] = local_58[2];
  V->v[0] = local_58[0];
  V->v[1] = local_58[1];
  lVar4 = 0;
  do {
    C->v[lVar4] = (this->super_Camera).T.v[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  return;
}

Assistant:

void PinholeCamera::reconstructRay(Vector3d &V, Vector3d &C, const Vector2d &p) const
{
  Vector3d Pc;
  reconstructLocal(Pc, p);

  V=getR()*Pc;
  C=getT();
}